

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stitching.cpp
# Opt level: O0

int print_stitched_file(map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                        *a_nodes_map,
                       map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                       *a_lines_map,
                       map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                       *b_nodes_map,
                       map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                       *b_lines_map,string *outfile_path,string *char_len_over)

{
  byte bVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  iterator __first_00;
  iterator __last_00;
  pointer ppVar3;
  pointer ppVar4;
  ostream *poVar5;
  _Self local_2a8;
  _Self local_2a0;
  iterator j;
  _Self local_290;
  _Base_ptr local_288;
  _Self local_280;
  _Self local_278;
  iterator i;
  string local_260 [8];
  ofstream geo_file;
  string *char_len_over_local;
  string *outfile_path_local;
  map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  *b_lines_map_local;
  map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *b_nodes_map_local;
  map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  *a_lines_map_local;
  map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *a_nodes_map_local;
  
  __first = std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::begin
                      (b_nodes_map);
  __last = std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::end
                     (b_nodes_map);
  std::map<int,node,std::less<int>,std::allocator<std::pair<int_const,node>>>::
  insert<std::_Rb_tree_iterator<std::pair<int_const,node>>>
            ((map<int,node,std::less<int>,std::allocator<std::pair<int_const,node>>> *)a_nodes_map,
             (_Rb_tree_iterator<std::pair<const_int,_node>_>)__first._M_node,
             (_Rb_tree_iterator<std::pair<const_int,_node>_>)__last._M_node);
  __first_00 = std::
               map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
               ::begin(b_lines_map);
  __last_00 = std::
              map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
              ::end(b_lines_map);
  std::map<int,stitch::line,std::less<int>,std::allocator<std::pair<int_const,stitch::line>>>::
  insert<std::_Rb_tree_iterator<std::pair<int_const,stitch::line>>>
            ((map<int,stitch::line,std::less<int>,std::allocator<std::pair<int_const,stitch::line>>>
              *)a_lines_map,
             (_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>)__first_00._M_node,
             (_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>)__last_00._M_node);
  std::ofstream::ofstream(local_260);
  std::ofstream::open(local_260,(_Ios_Openmode)outfile_path);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Unable to create new meshfile.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    a_nodes_map_local._4_4_ = 1;
  }
  else {
    std::operator<<((ostream *)local_260,
                    "//========================== Border Nodes ==========================\n");
    local_278._M_node =
         (_Base_ptr)
         std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::begin
                   (a_nodes_map);
    bVar2 = std::operator==(char_len_over,"");
    if (bVar2) {
      while( true ) {
        local_280._M_node =
             (_Base_ptr)
             std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::end
                       (a_nodes_map);
        bVar2 = std::operator!=(&local_278,&local_280);
        if (!bVar2) break;
        poVar5 = std::operator<<((ostream *)local_260,"Point(");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar3->first);
        poVar5 = std::operator<<(poVar5,") = {");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).x);
        poVar5 = std::operator<<(poVar5,", ");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).y);
        poVar5 = std::operator<<(poVar5,", ");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).z);
        poVar5 = std::operator<<(poVar5,", ");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).characteristic_length);
        std::operator<<(poVar5,"};\n");
        local_288 = (_Base_ptr)
                    std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator++(&local_278,0);
      }
    }
    else {
      while( true ) {
        local_290._M_node =
             (_Base_ptr)
             std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::end
                       (a_nodes_map);
        bVar2 = std::operator!=(&local_278,&local_290);
        if (!bVar2) break;
        poVar5 = std::operator<<((ostream *)local_260,"Point(");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar3->first);
        poVar5 = std::operator<<(poVar5,") = {");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).x);
        poVar5 = std::operator<<(poVar5,", ");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).y);
        poVar5 = std::operator<<(poVar5,", ");
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator->(&local_278);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar3->second).z);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = std::operator<<(poVar5,(string *)char_len_over);
        std::operator<<(poVar5,"};\n");
        j._M_node = (_Base_ptr)
                    std::_Rb_tree_iterator<std::pair<const_int,_node>_>::operator++(&local_278,0);
      }
    }
    std::operator<<((ostream *)local_260,
                    "//========================== Shape Faces ===========================\n");
    local_2a0._M_node =
         (_Base_ptr)
         std::
         map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
         ::begin(a_lines_map);
    while( true ) {
      local_2a8._M_node =
           (_Base_ptr)
           std::
           map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
           ::end(a_lines_map);
      bVar2 = std::operator!=(&local_2a0,&local_2a8);
      if (!bVar2) break;
      poVar5 = std::operator<<((ostream *)local_260,"Line(");
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>::operator->(&local_2a0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar4->first);
      poVar5 = std::operator<<(poVar5,") = {");
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>::operator->(&local_2a0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar4->second).first);
      poVar5 = std::operator<<(poVar5,", ");
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>::operator->(&local_2a0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar4->second).second);
      std::operator<<(poVar5,"};\n");
      std::_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>::operator++(&local_2a0,0);
    }
    std::operator<<((ostream *)local_260,
                    "//============================== END ================================\n");
    std::ofstream::close();
    a_nodes_map_local._4_4_ = 0;
  }
  std::ofstream::~ofstream(local_260);
  return a_nodes_map_local._4_4_;
}

Assistant:

int print_stitched_file(map<int, node> &a_nodes_map,
                        map<int, stitch::line> &a_lines_map,
                        map<int, node> &b_nodes_map,
                        map<int, stitch::line> &b_lines_map,
                        const string &outfile_path,
                        const string &char_len_over) {
  a_nodes_map.insert(b_nodes_map.begin(), b_nodes_map.end());
  a_lines_map.insert(b_lines_map.begin(), b_lines_map.end());
  ofstream geo_file;
  geo_file.open(outfile_path);
  if (geo_file.is_open()) {
    geo_file << "//========================== Border Nodes ==========================\n";
    auto i = a_nodes_map.begin();
    if (char_len_over == "") {
      while (i != a_nodes_map.end()) {
        geo_file << "Point(" << i->first << ") = {" << i->second.x << ", "
                 << i->second.y << ", " << i->second.z << ", "
                 << i->second.characteristic_length << "};\n";
        i++;
      }
    } else {
      while (i != a_nodes_map.end()) {
        geo_file << "Point(" << i->first << ") = {" << i->second.x << ", "
                 << i->second.y << ", " << i->second.z << ", "
                 << char_len_over << "};\n";
        i++;
      }
    }
    geo_file << "//========================== Shape Faces ===========================\n";
    auto j = a_lines_map.begin();
    while (j != a_lines_map.end()) {
      geo_file << "Line(" << j->first << ") = {" << j->second.first << ", "
               << j->second.second << "};\n";
      j++;
    }
    geo_file << "//============================== END ================================\n";
    geo_file.close();
    return 0;
  } else {
    cout << "Unable to create new meshfile." << endl;
    return 1;
  }
}